

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O3

void plutovg_matrix_rotate(plutovg_matrix_t *matrix,float angle)

{
  float fVar1;
  plutovg_matrix_t local_20;
  
  fVar1 = cosf(angle);
  local_20.b = sinf(angle);
  local_20.c = -local_20.b;
  local_20.e = 0.0;
  local_20.f = 0.0;
  local_20.a = fVar1;
  local_20.d = fVar1;
  plutovg_matrix_multiply(matrix,&local_20,matrix);
  return;
}

Assistant:

void plutovg_matrix_rotate(plutovg_matrix_t* matrix, float angle)
{
    plutovg_matrix_t m;
    plutovg_matrix_init_rotate(&m, angle);
    plutovg_matrix_multiply(matrix, &m, matrix);
}